

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktQueryPoolStatisticsTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::QueryPool::anon_unknown_0::ComputeInvocationsSecondaryTestInstance::executeTest
          (TestStatus *__return_storage_ptr__,ComputeInvocationsSecondaryTestInstance *this,
          VkCommandPool *cmdPool,VkPipelineLayout pipelineLayout,VkDescriptorSet *descriptorSet,
          SharedPtr<vkt::Draw::Buffer> *buffer,VkDeviceSize bufferSizeBytes)

{
  vector<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute,_std::allocator<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute>_>
  *pvVar1;
  pointer pPVar2;
  TestStatus *pTVar3;
  VkCommandPool *pVVar4;
  VkResult VVar5;
  DeviceInterface *vk;
  VkDevice device;
  Unique<vk::Handle<(vk::HandleType)14>_> *ptr;
  ProgramBinary *binary;
  Unique<vk::Handle<(vk::HandleType)18>_> *ptr_00;
  ulong uVar6;
  size_t parametersNdx;
  long lVar7;
  long lVar8;
  RefBase<vk::VkCommandBuffer_s_*> local_1f8;
  RefBase<vk::Handle<(vk::HandleType)11>_> local_1d8;
  SharedPtr<vkt::Draw::Buffer> *local_1b8;
  deUint64 local_1b0;
  SharedPtr<vkt::Draw::Buffer> local_1a8;
  SharedPtr<vkt::Draw::Buffer> local_198;
  undefined1 local_188 [16];
  VkDevice local_178;
  VkCommandPool VStack_170;
  void *local_168;
  undefined8 local_160;
  VkShaderModule local_158;
  char *local_150;
  VkSpecializationInfo *local_148;
  VkPipelineLayout local_140;
  VkPipeline local_138;
  deInt32 local_130;
  TestStatus *local_128;
  VkQueue local_120;
  VkDescriptorSet *local_118;
  VkCommandPool *local_110;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
  pipeline;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>_>_>
  shaderModule;
  undefined4 local_c8 [2];
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  deUint64 local_a8;
  undefined8 local_a0;
  VkDeviceSize local_98;
  undefined4 local_90 [2];
  undefined8 local_88;
  undefined8 local_80;
  undefined8 uStack_78;
  deUint64 local_70;
  undefined8 local_68;
  VkDeviceSize local_60;
  RefBase<vk::Handle<(vk::HandleType)11>_> local_58;
  
  local_1b0 = pipelineLayout.m_internal;
  local_128 = __return_storage_ptr__;
  local_118 = descriptorSet;
  local_110 = cmdPool;
  vk = Context::getDeviceInterface
                 ((this->super_ComputeInvocationsTestInstance).super_StatisticQueryTestInstance.
                  super_TestInstance.m_context);
  device = Context::getDevice((this->super_ComputeInvocationsTestInstance).
                              super_StatisticQueryTestInstance.super_TestInstance.m_context);
  local_120 = Context::getUniversalQueue
                        ((this->super_ComputeInvocationsTestInstance).
                         super_StatisticQueryTestInstance.super_TestInstance.m_context);
  local_c8[0] = 0x2c;
  local_88 = 0;
  local_80 = 0x4000000040;
  uStack_78 = 0xffffffffffffffff;
  local_a8 = (buffer->m_ptr->m_object).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
             m_internal;
  local_68 = 0;
  local_c0 = 0;
  local_60 = bufferSizeBytes;
  local_b8 = 0x200000000040;
  uStack_b0 = 0xffffffffffffffff;
  local_a0 = 0;
  local_98 = bufferSizeBytes;
  shaderModule.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  shaderModule.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  shaderModule.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pipeline.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  pipeline.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pipeline.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar7 = 0x18;
  uVar6 = 0;
  local_1b8 = buffer;
  local_90[0] = local_c8[0];
  local_70 = local_a8;
  while( true ) {
    pVVar4 = local_110;
    pvVar1 = (this->super_ComputeInvocationsTestInstance).m_parameters;
    if ((ulong)(((long)(pvVar1->
                       super__Vector_base<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute,_std::allocator<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute>_>
                       )._M_impl.super__Vector_impl_data._M_finish -
                (long)(pvVar1->
                      super__Vector_base<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute,_std::allocator<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute>_>
                      )._M_impl.super__Vector_impl_data._M_start) / 0x38) <= uVar6) break;
    ptr = (Unique<vk::Handle<(vk::HandleType)14>_> *)operator_new(0x20);
    binary = ::vk::ProgramCollection<vk::ProgramBinary>::get
                       (((this->super_ComputeInvocationsTestInstance).
                         super_StatisticQueryTestInstance.super_TestInstance.m_context)->
                        m_progCollection,
                        (string *)
                        ((long)(((pvVar1->
                                 super__Vector_base<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute,_std::allocator<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute>_>
                                 )._M_impl.super__Vector_impl_data._M_start)->localSize).m_data +
                        lVar7));
    ::vk::createShaderModule((Move<vk::Handle<(vk::HandleType)14>_> *)local_188,vk,device,binary,0);
    (ptr->super_RefBase<vk::Handle<(vk::HandleType)14>_>).m_data.deleter.m_device = local_178;
    (ptr->super_RefBase<vk::Handle<(vk::HandleType)14>_>).m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)VStack_170.m_internal;
    (ptr->super_RefBase<vk::Handle<(vk::HandleType)14>_>).m_data.object.m_internal = local_188._0_8_
    ;
    (ptr->super_RefBase<vk::Handle<(vk::HandleType)14>_>).m_data.deleter.m_deviceIface =
         (DeviceInterface *)local_188._8_8_;
    local_188._0_8_ = (VkCommandBuffer_s *)0x0;
    local_188._8_8_ = (DeviceInterface *)0x0;
    local_178 = (VkDevice)0x0;
    VStack_170.m_internal = 0;
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>::SharedPtr
              ((SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_> *)&local_1f8,ptr
              );
    std::
    vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>>>>>
    ::emplace_back<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>>>>
              ((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>>>>>
                *)&shaderModule,
               (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_> *)&local_1f8);
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>::release
              ((SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_> *)&local_1f8);
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase
              ((RefBase<vk::Handle<(vk::HandleType)14>_> *)local_188);
    local_158.m_internal =
         ((shaderModule.
           super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1].m_ptr)->
         super_RefBase<vk::Handle<(vk::HandleType)14>_>).m_data.object.m_internal;
    local_188._0_4_ = 0x1d;
    local_188._8_8_ = (DeviceInterface *)0x0;
    local_178 = (VkDevice)((ulong)local_178 & 0xffffffff00000000);
    VStack_170.m_internal._0_4_ = 0x12;
    local_168 = (void *)0x0;
    local_160._0_4_ = 0;
    local_160._4_4_ = VK_SHADER_STAGE_COMPUTE_BIT;
    local_150 = "main";
    local_148 = (VkSpecializationInfo *)0x0;
    local_140.m_internal = local_1b0;
    local_138.m_internal = 0;
    local_130 = 0;
    ptr_00 = (Unique<vk::Handle<(vk::HandleType)18>_> *)operator_new(0x20);
    ::vk::createComputePipeline
              ((Move<vk::Handle<(vk::HandleType)18>_> *)&local_1f8,vk,device,(VkPipelineCache)0x0,
               (VkComputePipelineCreateInfo *)local_188,(VkAllocationCallbacks *)0x0);
    (ptr_00->super_RefBase<vk::Handle<(vk::HandleType)18>_>).m_data.deleter.m_device =
         local_1f8.m_data.deleter.m_device;
    (ptr_00->super_RefBase<vk::Handle<(vk::HandleType)18>_>).m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)local_1f8.m_data.deleter.m_pool.m_internal;
    (ptr_00->super_RefBase<vk::Handle<(vk::HandleType)18>_>).m_data.object.m_internal =
         (deUint64)local_1f8.m_data.object;
    (ptr_00->super_RefBase<vk::Handle<(vk::HandleType)18>_>).m_data.deleter.m_deviceIface =
         local_1f8.m_data.deleter.m_deviceIface;
    local_1f8.m_data.object = (VkCommandBuffer)0x0;
    local_1f8.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
    local_1f8.m_data.deleter.m_device = (VkDevice)0x0;
    local_1f8.m_data.deleter.m_pool.m_internal = 0;
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>::SharedPtr
              ((SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_> *)&local_1d8,
               ptr_00);
    std::
    vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>>>>>
    ::emplace_back<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>>>>
              ((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>>>>>
                *)&pipeline,
               (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_> *)&local_1d8);
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>::release
              ((SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_> *)&local_1d8);
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase
              ((RefBase<vk::Handle<(vk::HandleType)18>_> *)&local_1f8);
    uVar6 = uVar6 + 1;
    lVar7 = lVar7 + 0x38;
  }
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)&local_1f8,vk,device,
             (VkCommandPool)local_110->m_internal,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  local_178 = local_1f8.m_data.deleter.m_device;
  VStack_170.m_internal = local_1f8.m_data.deleter.m_pool.m_internal;
  local_188._0_8_ = local_1f8.m_data.object;
  local_188._8_8_ = local_1f8.m_data.deleter.m_deviceIface;
  local_1f8.m_data.object = (VkCommandBuffer_s *)0x0;
  local_1f8.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_1f8.m_data.deleter.m_device = (VkDevice)0x0;
  local_1f8.m_data.deleter.m_pool.m_internal = 0;
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase(&local_1f8);
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)&local_1d8,vk,device,(VkCommandPool)pVVar4->m_internal
             ,VK_COMMAND_BUFFER_LEVEL_SECONDARY);
  local_1f8.m_data.deleter.m_device = local_1d8.m_data.deleter.m_device;
  local_1f8.m_data.deleter.m_pool.m_internal = (deUint64)local_1d8.m_data.deleter.m_allocator;
  local_1f8.m_data.object = (VkCommandBuffer_s *)local_1d8.m_data.object.m_internal;
  local_1f8.m_data.deleter.m_deviceIface = local_1d8.m_data.deleter.m_deviceIface;
  local_1d8.m_data.object.m_internal = 0;
  local_1d8.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_1d8.m_data.deleter.m_device = (VkDevice)0x0;
  local_1d8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
            ((RefBase<vk::VkCommandBuffer_s_*> *)&local_1d8);
  makeQueryPool((Move<vk::Handle<(vk::HandleType)11>_> *)&local_58,vk,device,0x400);
  local_1d8.m_data.deleter.m_device = local_58.m_data.deleter.m_device;
  local_1d8.m_data.deleter.m_allocator = local_58.m_data.deleter.m_allocator;
  local_1d8.m_data.object.m_internal = local_58.m_data.object.m_internal;
  local_1d8.m_data.deleter.m_deviceIface = local_58.m_data.deleter.m_deviceIface;
  local_58.m_data.object.m_internal = 0;
  local_58.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_58.m_data.deleter.m_device = (VkDevice)0x0;
  local_58.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)11>_>::~RefBase(&local_58);
  local_198.m_ptr = local_1b8->m_ptr;
  local_198.m_state = local_1b8->m_state;
  if (local_198.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (local_198.m_state)->strongRefCount = (local_198.m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (local_198.m_state)->weakRefCount = (local_198.m_state)->weakRefCount + 1;
    UNLOCK();
  }
  clearBuffer(vk,device,&local_198,bufferSizeBytes);
  de::SharedPtr<vkt::Draw::Buffer>::~SharedPtr(&local_198);
  beginSecondaryCommandBuffer
            (vk,local_1f8.m_data.object,0x400,(VkRenderPass)0x0,(VkFramebuffer)0x0,1);
  (*vk->_vptr_DeviceInterface[0x56])(vk,local_1f8.m_data.object,1,local_1b0,0,1,local_118,0,0);
  (*vk->_vptr_DeviceInterface[0x70])
            (vk,local_1f8.m_data.object,local_1d8.m_data.object.m_internal,0,1);
  (*vk->_vptr_DeviceInterface[0x6e])
            (vk,local_1f8.m_data.object,local_1d8.m_data.object.m_internal,0,0);
  lVar7 = 0x14;
  lVar8 = 0;
  uVar6 = 0;
  while( true ) {
    pvVar1 = (this->super_ComputeInvocationsTestInstance).m_parameters;
    if ((ulong)(((long)(pvVar1->
                       super__Vector_base<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute,_std::allocator<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute>_>
                       )._M_impl.super__Vector_impl_data._M_finish -
                (long)(pvVar1->
                      super__Vector_base<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute,_std::allocator<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute>_>
                      )._M_impl.super__Vector_impl_data._M_start) / 0x38) <= uVar6) break;
    (*vk->_vptr_DeviceInterface[0x4c])
              (vk,local_1f8.m_data.object,1,
               **(undefined8 **)
                 ((long)&(pipeline.
                          super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar8));
    pPVar2 = (((this->super_ComputeInvocationsTestInstance).m_parameters)->
             super__Vector_base<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute,_std::allocator<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute>_>
             )._M_impl.super__Vector_impl_data._M_start;
    (*vk->_vptr_DeviceInterface[0x5d])
              (vk,local_1f8.m_data.object,
               (ulong)*(uint *)((long)(pPVar2->localSize).m_data + lVar7 + -8),
               (ulong)*(uint *)((long)(pPVar2->localSize).m_data + lVar7 + -4));
    (*vk->_vptr_DeviceInterface[0x6d])(vk,local_1f8.m_data.object,0x800,0x800,0,0,0,1,local_90,0,0);
    uVar6 = uVar6 + 1;
    lVar7 = lVar7 + 0x38;
    lVar8 = lVar8 + 0x10;
  }
  (*vk->_vptr_DeviceInterface[0x6f])
            (vk,local_1f8.m_data.object,local_1d8.m_data.object.m_internal,0);
  VVar5 = (*vk->_vptr_DeviceInterface[0x4a])(vk,local_1f8.m_data.object);
  ::vk::checkResult(VVar5,"vk.endCommandBuffer(*secondaryCmdBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/query_pool/vktQueryPoolStatisticsTests.cpp"
                    ,0x206);
  beginCommandBuffer(vk,(VkCommandBuffer)local_188._0_8_);
  (*vk->_vptr_DeviceInterface[0x77])(vk,local_188._0_8_,1,&local_1f8);
  (*vk->_vptr_DeviceInterface[0x6d])(vk,local_188._0_8_,0x800,0x4000,0,0,0,1,local_c8,0,0);
  VVar5 = (*vk->_vptr_DeviceInterface[0x4a])(vk,local_188._0_8_);
  ::vk::checkResult(VVar5,"vk.endCommandBuffer(*primaryCmdBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/query_pool/vktQueryPoolStatisticsTests.cpp"
                    ,0x20e);
  submitCommandsAndWait(vk,device,local_120,(VkCommandBuffer)local_188._0_8_);
  pTVar3 = local_128;
  local_1a8.m_ptr = local_1b8->m_ptr;
  local_1a8.m_state = local_1b8->m_state;
  if (local_1a8.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (local_1a8.m_state)->strongRefCount = (local_1a8.m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (local_1a8.m_state)->weakRefCount = (local_1a8.m_state)->weakRefCount + 1;
    UNLOCK();
  }
  (*(this->super_ComputeInvocationsTestInstance).super_StatisticQueryTestInstance.super_TestInstance
    ._vptr_TestInstance[5])
            (local_128,this,&local_1a8,bufferSizeBytes,local_1d8.m_data.object.m_internal);
  de::SharedPtr<vkt::Draw::Buffer>::~SharedPtr(&local_1a8);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)11>_>::~RefBase(&local_1d8);
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase(&local_1f8);
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
            ((RefBase<vk::VkCommandBuffer_s_*> *)local_188);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
  ::~vector(&pipeline);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>_>_>
  ::~vector(&shaderModule);
  return pTVar3;
}

Assistant:

tcu::TestStatus ComputeInvocationsSecondaryTestInstance::executeTest (const VkCommandPool&			cmdPool,
																	  const VkPipelineLayout		pipelineLayout,
																	  const VkDescriptorSet&		descriptorSet,
																	  const de::SharedPtr<Buffer>	buffer,
																	  const VkDeviceSize			bufferSizeBytes)
{
	typedef de::SharedPtr<Unique<VkShaderModule> >	VkShaderModuleSp;
	typedef de::SharedPtr<Unique<VkPipeline> >		VkPipelineSp;

	const DeviceInterface&					vk							= m_context.getDeviceInterface();
	const VkDevice							device						= m_context.getDevice();
	const VkQueue							queue						= m_context.getUniversalQueue();

	const VkBufferMemoryBarrier				computeShaderWriteBarrier	=
	{
		VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER,	// VkStructureType	sType;
		DE_NULL,									// const void*		pNext;
		VK_ACCESS_SHADER_WRITE_BIT,					// VkAccessFlags	srcAccessMask;
		VK_ACCESS_SHADER_WRITE_BIT,					// VkAccessFlags	dstAccessMask;
		VK_QUEUE_FAMILY_IGNORED,					// deUint32			srcQueueFamilyIndex;
		VK_QUEUE_FAMILY_IGNORED,					// deUint32			destQueueFamilyIndex;
		buffer->object(),							// VkBuffer			buffer;
		0ull,										// VkDeviceSize		offset;
		bufferSizeBytes,							// VkDeviceSize		size;
	};

	const VkBufferMemoryBarrier				computeFinishBarrier		=
	{
		VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER,	// VkStructureType	sType;
		DE_NULL,									// const void*		pNext;
		VK_ACCESS_SHADER_WRITE_BIT,					// VkAccessFlags	srcAccessMask;
		VK_ACCESS_HOST_READ_BIT,					// VkAccessFlags	dstAccessMask;
		VK_QUEUE_FAMILY_IGNORED,					// deUint32			srcQueueFamilyIndex;
		VK_QUEUE_FAMILY_IGNORED,					// deUint32			destQueueFamilyIndex;
		buffer->object(),							// VkBuffer			buffer;
		0ull,										// VkDeviceSize		offset;
		bufferSizeBytes,							// VkDeviceSize		size;
	};

	std::vector<VkShaderModuleSp>			shaderModule;
	std::vector<VkPipelineSp>				pipeline;
	for(size_t parametersNdx = 0; parametersNdx < m_parameters.size(); ++parametersNdx)
	{
		shaderModule.push_back(VkShaderModuleSp(new Unique<VkShaderModule>(createShaderModule(vk, device, m_context.getBinaryCollection().get(m_parameters[parametersNdx].shaderName), (VkShaderModuleCreateFlags)0u))));
		const VkPipelineShaderStageCreateInfo	pipelineShaderStageParams	=
		{
			VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO,	// VkStructureType						sType;
			DE_NULL,												// const void*							pNext;
			0u,														// VkPipelineShaderStageCreateFlags		flags;
			VK_SHADER_STAGE_COMPUTE_BIT,							// VkShaderStageFlagBits				stage;
			shaderModule.back().get()->get(),						// VkShaderModule						module;
			"main",													// const char*							pName;
			DE_NULL,												// const VkSpecializationInfo*			pSpecializationInfo;
		};

		const VkComputePipelineCreateInfo		pipelineCreateInfo			=
		{
			VK_STRUCTURE_TYPE_COMPUTE_PIPELINE_CREATE_INFO,	// VkStructureType					sType;
			DE_NULL,										// const void*						pNext;
			0u,												// VkPipelineCreateFlags			flags;
			pipelineShaderStageParams,						// VkPipelineShaderStageCreateInfo	stage;
			pipelineLayout,									// VkPipelineLayout					layout;
			DE_NULL,										// VkPipeline						basePipelineHandle;
			0,												// deInt32							basePipelineIndex;
		};
		pipeline.push_back(VkPipelineSp(new Unique<VkPipeline>(createComputePipeline(vk, device, DE_NULL , &pipelineCreateInfo))));
	}

	const Unique<VkCommandBuffer>				primaryCmdBuffer			(allocateCommandBuffer(vk, device, cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));
	const Unique<VkCommandBuffer>				secondaryCmdBuffer			(allocateCommandBuffer(vk, device, cmdPool, VK_COMMAND_BUFFER_LEVEL_SECONDARY));

	const Unique<VkQueryPool>					queryPool					(makeQueryPool(vk, device, VK_QUERY_PIPELINE_STATISTIC_COMPUTE_SHADER_INVOCATIONS_BIT));

	clearBuffer(vk, device, buffer, bufferSizeBytes);
	beginSecondaryCommandBuffer(vk, *secondaryCmdBuffer, VK_QUERY_PIPELINE_STATISTIC_COMPUTE_SHADER_INVOCATIONS_BIT);
		vk.cmdBindDescriptorSets(*secondaryCmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, pipelineLayout, 0u, 1u, &descriptorSet, 0u, DE_NULL);
		vk.cmdResetQueryPool(*secondaryCmdBuffer, *queryPool, 0u, 1u);
		vk.cmdBeginQuery(*secondaryCmdBuffer, *queryPool, 0u, (VkQueryControlFlags)0u);
		for(size_t parametersNdx = 0; parametersNdx < m_parameters.size(); ++parametersNdx)
		{
				vk.cmdBindPipeline(*secondaryCmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, pipeline[parametersNdx].get()->get());
				vk.cmdDispatch(*secondaryCmdBuffer, m_parameters[parametersNdx].groupSize.x(), m_parameters[parametersNdx].groupSize.y(), m_parameters[parametersNdx].groupSize.z());

				vk.cmdPipelineBarrier(*secondaryCmdBuffer, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT,
					(VkDependencyFlags)0u, 0u, (const VkMemoryBarrier*)DE_NULL, 1u, &computeShaderWriteBarrier, 0u, (const VkImageMemoryBarrier*)DE_NULL);
		}
		vk.cmdEndQuery(*secondaryCmdBuffer, *queryPool, 0u);
	VK_CHECK(vk.endCommandBuffer(*secondaryCmdBuffer));

	beginCommandBuffer(vk, *primaryCmdBuffer);
		vk.cmdExecuteCommands(*primaryCmdBuffer, 1u, &secondaryCmdBuffer.get());

		vk.cmdPipelineBarrier(*primaryCmdBuffer, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, VK_PIPELINE_STAGE_HOST_BIT,
			(VkDependencyFlags)0u, 0u, (const VkMemoryBarrier*)DE_NULL, 1u, &computeFinishBarrier, 0u, (const VkImageMemoryBarrier*)DE_NULL);

	VK_CHECK(vk.endCommandBuffer(*primaryCmdBuffer));

	// Wait for completion
	submitCommandsAndWait(vk, device, queue, *primaryCmdBuffer);
	return checkResult(buffer, bufferSizeBytes, *queryPool);
}